

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

QWidget * __thiscall QWidget::window(QWidget *this)

{
  bool bVar1;
  QWidget *in_RDI;
  QWidget *p;
  QWidget *w;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  QWidget *local_18;
  QWidget *local_10;
  
  local_18 = parentWidget((QWidget *)0x3609e1);
  local_10 = in_RDI;
  while( true ) {
    bVar1 = isWindow((QWidget *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
    in_stack_ffffffffffffffe7 = !bVar1 && local_18 != (QWidget *)0x0;
    if (bVar1 || local_18 == (QWidget *)0x0) break;
    local_10 = local_18;
    local_18 = parentWidget((QWidget *)0x360a28);
  }
  return local_10;
}

Assistant:

QWidget *QWidget::window() const
{
    QWidget *w = const_cast<QWidget *>(this);
    QWidget *p = w->parentWidget();
    while (!w->isWindow() && p) {
        w = p;
        p = p->parentWidget();
    }
    return w;
}